

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QRegion __thiscall
QGraphicsViewPrivate::mapToViewRegion(QGraphicsViewPrivate *this,QGraphicsItem *item,QRectF *rect)

{
  QGraphicsItemPrivate *this_00;
  long lVar1;
  qreal *pqVar2;
  QTransform *pQVar3;
  long in_FS_OFFSET;
  byte bVar4;
  QTransform itv;
  undefined1 local_e0 [8];
  QTransform local_d8;
  QTransform local_88;
  long local_38;
  
  bVar4 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (item->d_ptr).d;
  if (((ulong)item[0x30]._vptr_QGraphicsItem & 0x20) != 0) {
    updateScroll((QGraphicsViewPrivate *)item);
  }
  pqVar2 = (qreal *)&DAT_00704bf8;
  pQVar3 = &local_88;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pQVar3->m_matrix[0][0] = *pqVar2;
    pqVar2 = pqVar2 + (ulong)bVar4 * -2 + 1;
    pQVar3 = (QTransform *)((long)pQVar3 + ((ulong)bVar4 * -2 + 1) * 8);
  }
  QGraphicsView::viewportTransform(&local_d8,(QGraphicsView *)this_00);
  QGraphicsItem::deviceTransform(&local_88,(QGraphicsItem *)rect,&local_d8);
  QGraphicsItem::boundingRegion((QGraphicsItem *)local_e0,(QTransform *)rect);
  QTransform::mapRect((QRectF *)&local_d8);
  QRectF::toAlignedRect();
  QRegion::operator&((QRegion *)this,(QRect *)local_e0);
  QRegion::~QRegion((QRegion *)local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QRegion)(QRegionData *)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QGraphicsViewPrivate::mapToViewRegion(const QGraphicsItem *item, const QRectF &rect) const
{
    Q_Q(const QGraphicsView);
    if (dirtyScroll)
        const_cast<QGraphicsViewPrivate *>(this)->updateScroll();

    // Accurate bounding region
    QTransform itv = item->deviceTransform(q->viewportTransform());
    return item->boundingRegion(itv) & itv.mapRect(rect).toAlignedRect();
}